

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::AddGenericFrame(Segment *this,Frame *frame)

{
  Cluster *this_00;
  bool bVar1;
  bool bVar2;
  uint64_t uVar3;
  Track *pTVar4;
  int64_t iVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  Frame *pFVar8;
  Frame *local_e8;
  Frame *local_b8;
  Frame *new_frame_1;
  bool frame_created;
  Cluster *cluster;
  Frame *new_frame;
  uint64_t rel_timecode;
  uint64_t last_cluster_timecode;
  Cluster *last_cluster;
  uint64_t frame_timecode;
  uint64_t timecode_scale;
  Frame *frame_local;
  Segment *this_local;
  
  if (frame == (Frame *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = CheckHeaderInfo(this);
    if (bVar1) {
      uVar3 = Frame::timestamp(frame);
      if (uVar3 < this->last_timestamp_) {
        this_local._7_1_ = false;
      }
      else {
        uVar3 = Frame::track_number(frame);
        pTVar4 = Tracks::GetTrackByNumber(&this->tracks_,uVar3);
        if (pTVar4 == (Track *)0x0) {
          this_local._7_1_ = false;
        }
        else {
          iVar5 = Frame::discard_padding(frame);
          if (iVar5 != 0) {
            this->doc_type_version_ = 4;
          }
          if (0 < this->cluster_list_size_) {
            uVar3 = SegmentInfo::timecode_scale(&this->segment_info_);
            uVar6 = Frame::timestamp(frame);
            uVar7 = Cluster::timecode(this->cluster_list_[this->cluster_list_size_ + -1]);
            if (0x7fff < uVar6 / uVar3 - uVar7) {
              this->force_new_cluster_ = true;
            }
          }
          if ((this->has_video_ & 1U) != 0) {
            uVar3 = Frame::track_number(frame);
            bVar1 = Tracks::TrackIsAudio(&this->tracks_,uVar3);
            if ((bVar1) && ((this->force_new_cluster_ & 1U) == 0)) {
              pFVar8 = (Frame *)operator_new(0x68,(nothrow_t *)&std::nothrow);
              local_b8 = (Frame *)0x0;
              if (pFVar8 != (Frame *)0x0) {
                Frame::Frame(pFVar8);
                local_b8 = pFVar8;
              }
              if ((local_b8 != (Frame *)0x0) && (bVar1 = Frame::CopyFrom(local_b8,frame), bVar1)) {
                bVar1 = QueueFrame(this,local_b8);
                if (!bVar1) {
                  if (local_b8 != (Frame *)0x0) {
                    Frame::~Frame(local_b8);
                    operator_delete(local_b8);
                  }
                  return false;
                }
                uVar3 = Frame::track_number(frame);
                this->track_frames_written_[uVar3 - 1] = this->track_frames_written_[uVar3 - 1] + 1;
                return true;
              }
              if (local_b8 != (Frame *)0x0) {
                Frame::~Frame(local_b8);
                operator_delete(local_b8);
              }
              return false;
            }
          }
          uVar3 = Frame::track_number(frame);
          uVar6 = Frame::timestamp(frame);
          bVar1 = Frame::is_key(frame);
          bVar1 = DoNewClusterProcessing(this,uVar3,uVar6,bVar1);
          if (bVar1) {
            if (this->cluster_list_size_ < 1) {
              this_local._7_1_ = false;
            }
            else {
              this_00 = this->cluster_list_[this->cluster_list_size_ + -1];
              if (this_00 == (Cluster *)0x0) {
                this_local._7_1_ = false;
              }
              else {
                bVar1 = false;
                bVar2 = Frame::CanBeSimpleBlock(frame);
                timecode_scale = (uint64_t)frame;
                if (((!bVar2) && (bVar2 = Frame::is_key(frame), !bVar2)) &&
                   (bVar2 = Frame::reference_block_timestamp_set(frame), !bVar2)) {
                  pFVar8 = (Frame *)operator_new(0x68,(nothrow_t *)&std::nothrow);
                  local_e8 = (Frame *)0x0;
                  if (pFVar8 != (Frame *)0x0) {
                    Frame::Frame(pFVar8);
                    local_e8 = pFVar8;
                  }
                  if ((local_e8 == (Frame *)0x0) ||
                     (bVar1 = Frame::CopyFrom(local_e8,frame), !bVar1)) {
                    if (local_e8 != (Frame *)0x0) {
                      Frame::~Frame(local_e8);
                      operator_delete(local_e8);
                    }
                    return false;
                  }
                  uVar3 = Frame::track_number(frame);
                  Frame::set_reference_block_timestamp
                            (local_e8,this->last_track_timestamp_[uVar3 - 1]);
                  timecode_scale = (uint64_t)local_e8;
                  bVar1 = true;
                }
                bVar2 = Cluster::AddFrame(this_00,(Frame *)timecode_scale);
                if (bVar2) {
                  if (((this->new_cuepoint_ & 1U) != 0) &&
                     (uVar3 = this->cues_track_,
                     uVar6 = Frame::track_number((Frame *)timecode_scale), uVar3 == uVar6)) {
                    uVar3 = Frame::timestamp((Frame *)timecode_scale);
                    bVar2 = AddCuePoint(this,uVar3,this->cues_track_);
                    if (!bVar2) {
                      return false;
                    }
                  }
                  uVar3 = Frame::timestamp((Frame *)timecode_scale);
                  this->last_timestamp_ = uVar3;
                  uVar3 = Frame::timestamp((Frame *)timecode_scale);
                  uVar6 = Frame::track_number((Frame *)timecode_scale);
                  this->last_track_timestamp_[uVar6 - 1] = uVar3;
                  uVar3 = Frame::duration((Frame *)timecode_scale);
                  this->last_block_duration_ = uVar3;
                  uVar3 = Frame::track_number((Frame *)timecode_scale);
                  this->track_frames_written_[uVar3 - 1] =
                       this->track_frames_written_[uVar3 - 1] + 1;
                  if ((bVar1) && (timecode_scale != 0)) {
                    Frame::~Frame((Frame *)timecode_scale);
                    operator_delete((void *)timecode_scale);
                  }
                  this_local._7_1_ = true;
                }
                else {
                  this_local._7_1_ = false;
                }
              }
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Segment::AddGenericFrame(const Frame* frame) {
  if (!frame)
    return false;

  if (!CheckHeaderInfo())
    return false;

  // Check for non-monotonically increasing timestamps.
  if (frame->timestamp() < last_timestamp_)
    return false;

  // Check if the track number is valid.
  if (!tracks_.GetTrackByNumber(frame->track_number()))
    return false;

  if (frame->discard_padding() != 0)
    doc_type_version_ = 4;

  if (cluster_list_size_ > 0) {
    const uint64_t timecode_scale = segment_info_.timecode_scale();
    const uint64_t frame_timecode = frame->timestamp() / timecode_scale;

    const Cluster* const last_cluster = cluster_list_[cluster_list_size_ - 1];
    const uint64_t last_cluster_timecode = last_cluster->timecode();

    const uint64_t rel_timecode = frame_timecode - last_cluster_timecode;
    if (rel_timecode > kMaxBlockTimecode) {
      force_new_cluster_ = true;
    }
  }

  // If the segment has a video track hold onto audio frames to make sure the
  // audio that is associated with the start time of a video key-frame is
  // muxed into the same cluster.
  if (has_video_ && tracks_.TrackIsAudio(frame->track_number()) &&
      !force_new_cluster_) {
    Frame* const new_frame = new (std::nothrow) Frame();
    if (!new_frame || !new_frame->CopyFrom(*frame)) {
      delete new_frame;
      return false;
    }
    if (!QueueFrame(new_frame)) {
      delete new_frame;
      return false;
    }
    track_frames_written_[frame->track_number() - 1]++;
    return true;
  }

  if (!DoNewClusterProcessing(frame->track_number(), frame->timestamp(),
                              frame->is_key())) {
    return false;
  }

  if (cluster_list_size_ < 1)
    return false;

  Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];
  if (!cluster)
    return false;

  // If the Frame is not a SimpleBlock, then set the reference_block_timestamp
  // if it is not set already.
  bool frame_created = false;
  if (!frame->CanBeSimpleBlock() && !frame->is_key() &&
      !frame->reference_block_timestamp_set()) {
    Frame* const new_frame = new (std::nothrow) Frame();
    if (!new_frame || !new_frame->CopyFrom(*frame)) {
      delete new_frame;
      return false;
    }
    new_frame->set_reference_block_timestamp(
        last_track_timestamp_[frame->track_number() - 1]);
    frame = new_frame;
    frame_created = true;
  }

  if (!cluster->AddFrame(frame))
    return false;

  if (new_cuepoint_ && cues_track_ == frame->track_number()) {
    if (!AddCuePoint(frame->timestamp(), cues_track_))
      return false;
  }

  last_timestamp_ = frame->timestamp();
  last_track_timestamp_[frame->track_number() - 1] = frame->timestamp();
  last_block_duration_ = frame->duration();
  track_frames_written_[frame->track_number() - 1]++;

  if (frame_created)
    delete frame;
  return true;
}